

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O1

int base64_encode(char *in_bin,int in_len,char *out_base64,int out_len)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  uint codepos_3;
  int iVar10;
  uint codepos_2;
  
  if (out_len < 1 || in_len == 0) {
    uVar8 = 0;
    iVar2 = 0;
    pcVar5 = out_base64;
  }
  else {
    pbVar3 = (byte *)(in_bin + in_len);
    pcVar9 = out_base64 + out_len;
    iVar10 = 0;
    pcVar6 = out_base64;
    while( true ) {
      bVar1 = *in_bin;
      pcVar5 = pcVar6 + 1;
      *pcVar6 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 >> 2];
      uVar8 = (ulong)((bVar1 & 3) << 4);
      iVar2 = 1;
      if (((byte *)in_bin + 1 == pbVar3) || (pcVar9 <= pcVar5)) break;
      bVar1 = ((byte *)in_bin)[1];
      pcVar6[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [bVar1 >> 4 | uVar8];
      uVar8 = (ulong)((bVar1 & 0xf) << 2);
      iVar2 = 2;
      pcVar5 = pcVar6 + 2;
      if (((byte *)in_bin + 2 == pbVar3) || (pcVar9 <= pcVar6 + 4)) break;
      bVar1 = ((byte *)in_bin)[2];
      pcVar6[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [bVar1 >> 6 | uVar8];
      uVar8 = (ulong)(bVar1 & 0x3f);
      pcVar6[3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar8];
      iVar10 = iVar10 + 1;
      pcVar5 = pcVar6 + 4;
      if (iVar10 == 0x12) {
        pcVar6[4] = '\n';
        iVar10 = 0;
        pcVar5 = pcVar6 + 5;
      }
      pcVar6 = pcVar5;
      in_bin = (char *)((byte *)in_bin + 3);
      iVar2 = 0;
      pcVar5 = pcVar6;
      if (((byte *)in_bin == pbVar3) || (pcVar9 <= pcVar6)) break;
    }
  }
  iVar7 = (int)pcVar5 - (int)out_base64;
  pcVar5 = out_base64 + iVar7;
  iVar10 = out_len - iVar7;
  if (iVar2 == 2) {
    if (iVar10 < 2) {
LAB_00123d22:
      iVar2 = 0;
      goto LAB_00123d24;
    }
    pcVar6 = pcVar5 + 1;
    *pcVar5 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar8];
    lVar4 = 2;
LAB_00123d09:
    pcVar9 = pcVar5 + lVar4;
    *pcVar6 = '=';
  }
  else {
    pcVar9 = pcVar5;
    if (iVar2 == 1) {
      if (iVar10 < 3) goto LAB_00123d22;
      *pcVar5 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar8];
      pcVar6 = pcVar5 + 2;
      pcVar5[1] = '=';
      lVar4 = 3;
      goto LAB_00123d09;
    }
  }
  if (pcVar9 < pcVar5 + iVar10) {
    *pcVar9 = '\0';
  }
  iVar2 = (int)pcVar9 - (int)pcVar5;
LAB_00123d24:
  return iVar2 + iVar7;
}

Assistant:

int
base64_encode(const char *in_bin, int in_len,
	      char *out_base64, int out_len)
{
	struct base64_encodestate state;
	base64_encodestate_init(&state);
	int res = base64_encode_block(in_bin, in_len, out_base64,
				      out_len, &state);
	return res + base64_encode_blockend(out_base64 + res, out_len - res,
					    &state);
}